

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

bool __thiscall FlowGraph::IsUnsignedOpnd(FlowGraph *this,Opnd *src,Opnd **pShrSrc1)

{
  Opnd *this_00;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  int32 iVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  _func_int *p_Var7;
  
  OVar2 = IR::Opnd::GetKind(src);
  if (OVar2 == OpndKindReg) {
    OVar2 = IR::Opnd::GetKind(src);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_0041a7ef;
      *puVar5 = 0;
    }
    if (((ulong)src[1]._vptr_Opnd[3] & 1) == 0) {
      return false;
    }
    if (src[1]._vptr_Opnd[5] == (_func_int *)0x0) {
      return false;
    }
    OVar2 = IR::Opnd::GetKind(src);
    if (OVar2 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_0041a7ef;
      *puVar5 = 0;
    }
    bVar3 = StackSym::IsIntConst((StackSym *)src[1]._vptr_Opnd);
    OVar2 = IR::Opnd::GetKind(src);
    if (bVar3) {
      if (OVar2 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) {
LAB_0041a7ef:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      iVar4 = StackSym::GetIntConstValue((StackSym *)src[1]._vptr_Opnd);
      if (-1 < iVar4) {
LAB_0041a6c5:
        *pShrSrc1 = src;
        return true;
      }
    }
    else {
      if (OVar2 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar3) goto LAB_0041a7ef;
        *puVar5 = 0;
      }
      if (((ulong)src[1]._vptr_Opnd[3] & 1) == 0) {
        p_Var7 = (_func_int *)0x0;
      }
      else {
        p_Var7 = src[1]._vptr_Opnd[5];
      }
      if (*(short *)(p_Var7 + 0x30) != 0x3a) {
        return false;
      }
      this_00 = *(Opnd **)(p_Var7 + 0x50);
      OVar2 = IR::Opnd::GetKind(this_00);
      if (OVar2 == OpndKindReg) {
        OVar2 = IR::Opnd::GetKind(this_00);
        if (OVar2 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar3) goto LAB_0041a7ef;
          *puVar5 = 0;
        }
        bVar3 = StackSym::IsTaggableIntConst((StackSym *)this_00[1]._vptr_Opnd);
        if (bVar3) {
          pRVar6 = IR::Opnd::AsRegOpnd(this_00);
          iVar4 = StackSym::GetIntConstValue(pRVar6->m_sym);
          if (iVar4 == 0) {
            src = *(Opnd **)(p_Var7 + 0x48);
            goto LAB_0041a6c5;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool FlowGraph::IsUnsignedOpnd(IR::Opnd *src, IR::Opnd **pShrSrc1)
{
    // Look for an unsigned constant, or the result of an unsigned shift by zero
    if (!src->IsRegOpnd())
    {
        return false;
    }
    if (!src->AsRegOpnd()->m_sym->IsSingleDef())
    {
        return false;
    }

    if (src->AsRegOpnd()->m_sym->IsIntConst())
    {
        int32 intConst = src->AsRegOpnd()->m_sym->GetIntConstValue();

        if (intConst >= 0)
        {
            *pShrSrc1 = src;
            return true;
        }
        else
        {
            return false;
        }
    }

    IR::Instr * shrUInstr = src->AsRegOpnd()->m_sym->GetInstrDef();

    if (shrUInstr->m_opcode != Js::OpCode::ShrU_A)
    {
        return false;
    }

    IR::Opnd *shrCnt = shrUInstr->GetSrc2();

    if (!shrCnt->IsRegOpnd() || !shrCnt->AsRegOpnd()->m_sym->IsTaggableIntConst() || shrCnt->AsRegOpnd()->m_sym->GetIntConstValue() != 0)
    {
        return false;
    }

    IR::Opnd *shrSrc = shrUInstr->GetSrc1();

    *pShrSrc1 = shrSrc;
    return true;
}